

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitalPhaseLockedLoop.hpp
# Opt level: O3

void __thiscall
Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::post_phase_offset
          (DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL> *this,IntType new_phase,
          IntType new_offset)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  sVar1 = this->offset_history_pointer_;
  lVar3 = this->total_divisor_;
  lVar4 = (this->offset_history_)._M_elems[sVar1].divisor;
  lVar6 = this->total_spacing_;
  lVar7 = (this->offset_history_)._M_elems[sVar1].spacing;
  lVar2 = ((this->clocks_per_bit_ >> 1) + new_offset) / (long)this->clocks_per_bit_;
  lVar8 = 1;
  if (1 < lVar2) {
    lVar8 = lVar2;
  }
  (this->offset_history_)._M_elems[sVar1].divisor = lVar8;
  (this->offset_history_)._M_elems[sVar1].spacing = new_offset;
  lVar8 = lVar8 + (lVar3 - lVar4);
  this->total_divisor_ = lVar8;
  lVar4 = (lVar6 - lVar7) + new_offset;
  this->total_spacing_ = lVar4;
  this->offset_history_pointer_ = ((sVar1 + 1) / 3) * -3 + sVar1 + 1;
  lVar6 = 0x10;
  lVar3 = 0;
  lVar7 = 0;
  do {
    lVar3 = lVar3 + *(long *)((long)((this->offset_history_)._M_elems + -1) + lVar6);
    lVar7 = lVar7 + *(long *)((long)(this->offset_history_)._M_elems + lVar6 + -8);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  if (lVar7 == lVar4) {
    if (lVar3 == lVar8) {
      uVar5 = 1;
      if (1 < lVar4 / lVar8) {
        uVar5 = lVar4 / lVar8;
      }
      this->window_length_ = uVar5;
      this->phase_ = this->phase_ - ((long)((new_phase - (uVar5 >> 1)) + 1) >> 1);
      return;
    }
    __assert_fail("td == total_divisor_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/Controller/../DPLL/DigitalPhaseLockedLoop.hpp"
                  ,0x67,
                  "void Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller>::post_phase_offset(Cycles::IntType, Cycles::IntType) [BitHandler = Storage::Disk::Controller, length_of_history = 3]"
                 );
  }
  __assert_fail("ts == total_spacing_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/Controller/../DPLL/DigitalPhaseLockedLoop.hpp"
                ,0x66,
                "void Storage::DigitalPhaseLockedLoop<Storage::Disk::Controller>::post_phase_offset(Cycles::IntType, Cycles::IntType) [BitHandler = Storage::Disk::Controller, length_of_history = 3]"
               );
}

Assistant:

void post_phase_offset(Cycles::IntType new_phase, Cycles::IntType new_offset) {
			// Erase the effect of whatever is currently in this slot.
			total_divisor_ -= offset_history_[offset_history_pointer_].divisor;
			total_spacing_ -= offset_history_[offset_history_pointer_].spacing;

			// Fill in the new fields.
			const auto multiple = std::max((new_offset + (clocks_per_bit_ >> 1)) / clocks_per_bit_, Cycles::IntType(1));
			offset_history_[offset_history_pointer_].divisor = multiple;
			offset_history_[offset_history_pointer_].spacing = new_offset;

			// Add in the new values;
			total_divisor_ += offset_history_[offset_history_pointer_].divisor;
			total_spacing_ += offset_history_[offset_history_pointer_].spacing;

			// Advance the write slot.
			offset_history_pointer_ = (offset_history_pointer_ + 1) % offset_history_.size();

#ifndef NDEBUG
			Cycles::IntType td = 0, ts = 0;
			for(auto offset: offset_history_) {
				td += offset.divisor;
				ts += offset.spacing;
			}
			assert(ts == total_spacing_);
			assert(td == total_divisor_);
#endif

			// In net: use an unweighted average of the stored offsets to compute current window size,
			// bucketing them by rounding to the nearest multiple of the base clocks per bit
			window_length_ = std::max(total_spacing_ / total_divisor_, Cycles::IntType(1));

			// Also apply a difference to phase, use a simple spring mechanism as a lowpass filter.
			const auto error = new_phase - (window_length_ >> 1);
			phase_ -= (error + 1) >> 1;
		}